

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QStaticPlugin>::reallocate
          (QPodArrayOps<QStaticPlugin> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QStaticPlugin>_*,_QStaticPlugin_*> pVar1;
  
  pVar1 = QTypedArrayData<QStaticPlugin>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QStaticPlugin>).d,
                     (this->super_QArrayDataPointer<QStaticPlugin>).ptr,alloc,option);
  if (pVar1.second != (QStaticPlugin *)0x0) {
    (this->super_QArrayDataPointer<QStaticPlugin>).d = pVar1.first;
    (this->super_QArrayDataPointer<QStaticPlugin>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }